

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O0

SeatPromptResult *
console_confirm_weak_crypto_primitive
          (SeatPromptResult *__return_storage_ptr__,Seat *seat,char *algtype,char *algname,
          _func_void_void_ptr_SeatPromptResult *callback,void *ctx)

{
  undefined1 local_10c [8];
  termios newmode;
  termios oldmode;
  termios cf;
  char line [32];
  void *ctx_local;
  _func_void_void_ptr_SeatPromptResult *callback_local;
  char *algname_local;
  char *algtype_local;
  Seat *seat_local;
  
  premsg((termios *)&oldmode.c_ispeed);
  fprintf(_stderr,
          "The first %s supported by the server is\n%s, which is below the configured warning threshold.\n"
          ,algtype,algname);
  if ((console_batch_mode & 1U) == 0) {
    fputs("Continue with connection? (y/n) ",_stderr);
    fflush(_stderr);
    tcgetattr(0,(termios *)&newmode.c_ispeed);
    memcpy(local_10c,&newmode.c_ispeed,0x3c);
    newmode.c_oflag = newmode.c_oflag | 0xb;
    tcsetattr(0,0,(termios *)local_10c);
    cf.c_ispeed._0_1_ = '\0';
    block_and_read(0,&cf.c_ispeed,0x1f);
    tcsetattr(0,0,(termios *)&newmode.c_ispeed);
    if (((char)cf.c_ispeed == 'y') || ((char)cf.c_ispeed == 'Y')) {
      postmsg((termios *)&oldmode.c_ispeed);
      make_spr_simple(__return_storage_ptr__,SPRK_OK);
    }
    else {
      fputs("Connection abandoned.\n",_stderr);
      postmsg((termios *)&oldmode.c_ispeed);
      make_spr_simple(__return_storage_ptr__,SPRK_USER_ABORT);
    }
  }
  else {
    fputs("Connection abandoned.\n",_stderr);
    postmsg((termios *)&oldmode.c_ispeed);
    make_spr_sw_abort_static
              (__return_storage_ptr__,"Cannot confirm a weak crypto primitive in batch mode");
  }
  return __return_storage_ptr__;
}

Assistant:

SeatPromptResult console_confirm_weak_crypto_primitive(
    Seat *seat, const char *algtype, const char *algname,
    void (*callback)(void *ctx, SeatPromptResult result), void *ctx)
{
    char line[32];
    struct termios cf;

    premsg(&cf);
    fprintf(stderr, weakcrypto_msg_common_fmt, algtype, algname);

    if (console_batch_mode) {
        fputs(console_abandoned_msg, stderr);
        postmsg(&cf);
        return SPR_SW_ABORT("Cannot confirm a weak crypto primitive "
                            "in batch mode");
    }

    fputs(console_continue_prompt, stderr);
    fflush(stderr);

    {
        struct termios oldmode, newmode;
        tcgetattr(0, &oldmode);
        newmode = oldmode;
        newmode.c_lflag |= ECHO | ISIG | ICANON;
        tcsetattr(0, TCSANOW, &newmode);
        line[0] = '\0';
        if (block_and_read(0, line, sizeof(line) - 1) <= 0)
            /* handled below */;
        tcsetattr(0, TCSANOW, &oldmode);
    }

    if (line[0] == 'y' || line[0] == 'Y') {
        postmsg(&cf);
        return SPR_OK;
    } else {
        fputs(console_abandoned_msg, stderr);
        postmsg(&cf);
        return SPR_USER_ABORT;
    }
}